

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_events.cpp
# Opt level: O0

FEvent * __thiscall FEventTree::FindEvent(FEventTree *this,double key)

{
  double dVar1;
  FEventTree *local_28;
  FEvent *node;
  double key_local;
  FEventTree *this_local;
  
  local_28 = (FEventTree *)this->Root;
  while( true ) {
    if (local_28 == this) {
      return (FEvent *)0x0;
    }
    dVar1 = (local_28->Nil).Distance;
    if ((dVar1 == key) && (!NAN(dVar1) && !NAN(key))) break;
    if ((local_28->Nil).Distance <= key) {
      local_28 = (FEventTree *)(local_28->Nil).Right;
    }
    else {
      local_28 = (FEventTree *)(local_28->Nil).Left;
    }
  }
  return &local_28->Nil;
}

Assistant:

FEvent *FEventTree::FindEvent (double key) const
{
	FEvent *node = Root;

	while (node != &Nil)
	{
		if (node->Distance == key)
		{
			return node;
		}
		else if (node->Distance > key)
		{
			node = node->Left;
		}
		else
		{
			node = node->Right;
		}
	}
	return NULL;
}